

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void report(basic_ostream<char,_std::char_traits<char>_> *stream,NodeList *points)

{
  pointer ppNVar1;
  ostream *poVar2;
  pointer ppNVar3;
  
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  ppNVar1 = (points->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar3 = (points->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppNVar3 != ppNVar1; ppNVar3 = ppNVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  std::ostream::flush();
  return;
}

Assistant:

void report(std::basic_ostream<char>& stream, NodeList& points) {
    stream << points.size() << " ";
    for (Node* n : points) {
        stream << n->id << " ";
    }
    stream << std::endl;
}